

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Generators<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_> *
Catch::Generators::
makeGenerators<unary_op_tuple<trng::portable_impl::uint128,unsigned_long>,unary_op_tuple<trng::portable_impl::uint128,unsigned_long>,unary_op_tuple<trng::portable_impl::uint128,unsigned_long>,unary_op_tuple<trng::portable_impl::uint128,unsigned_long>>
          (unary_op_tuple<trng::portable_impl::uint128,_unsigned_long> *val,
          unary_op_tuple<trng::portable_impl::uint128,_unsigned_long> *moreGenerators,
          unary_op_tuple<trng::portable_impl::uint128,_unsigned_long> *moreGenerators_1,
          unary_op_tuple<trng::portable_impl::uint128,_unsigned_long> *moreGenerators_2)

{
  unary_op_tuple<trng::portable_impl::uint128,_unsigned_long> *in_RDX;
  Generators<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_> *in_RDI;
  Generators<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_> *moreGenerators_2_00;
  unary_op_tuple<trng::portable_impl::uint128,_unsigned_long> *moreGenerators_1_00;
  unary_op_tuple<trng::portable_impl::uint128,_unsigned_long> *in_stack_ffffffffffffffc0;
  GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>
  *in_stack_ffffffffffffffc8;
  unary_op_tuple<trng::portable_impl::uint128,_unsigned_long> local_30;
  
  moreGenerators_1_00 = &local_30;
  moreGenerators_2_00 = in_RDI;
  value<unary_op_tuple<trng::portable_impl::uint128,unsigned_long>>(in_RDX);
  makeGenerators<unary_op_tuple<trng::portable_impl::uint128,unsigned_long>,unary_op_tuple<trng::portable_impl::uint128,unsigned_long>,unary_op_tuple<trng::portable_impl::uint128,unsigned_long>,unary_op_tuple<trng::portable_impl::uint128,unsigned_long>>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,moreGenerators_1_00,
             (unary_op_tuple<trng::portable_impl::uint128,_unsigned_long> *)moreGenerators_2_00);
  GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_>::~GeneratorWrapper
            ((GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,_unsigned_long>_> *)
             0x42bc67);
  return in_RDI;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }